

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_exp.c
# Opt level: O0

int BN_mod_exp_simple(BIGNUM *r,BIGNUM *a,BIGNUM *p,BIGNUM *m,BN_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  BIGNUM *r_00;
  BIGNUM *pBVar3;
  BIGNUM *val [32];
  BIGNUM *d;
  int start;
  int wvalue;
  int window;
  int wend;
  int wstart;
  int ret;
  int bits;
  int j;
  int i;
  uint local_174;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffe98;
  int line;
  char *in_stack_fffffffffffffea0;
  uint local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_34;
  
  line = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_40 = 0;
  iVar2 = BN_get_flags((BIGNUM *)p,4);
  if (((iVar2 != 0) || (iVar2 = BN_get_flags((BIGNUM *)a,4), iVar2 != 0)) ||
     (iVar2 = BN_get_flags((BIGNUM *)m,4), iVar2 != 0)) {
    ERR_new();
    ERR_set_debug(in_stack_fffffffffffffea0,line,
                  (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    ERR_set_error(3,0xc0101,(char *)0x0);
    return 0;
  }
  local_44 = BN_num_bits(p);
  if (local_44 == 0) {
    iVar2 = BN_abs_is_word((BIGNUM *)m,1);
    if (iVar2 == 0) {
      local_40 = BN_set_word(r,1);
    }
    else {
      local_40 = 1;
      BN_zero_ex((BIGNUM *)r);
    }
    return local_40;
  }
  BN_CTX_start(ctx);
  r_00 = BN_CTX_get(ctx);
  pBVar3 = BN_CTX_get(ctx);
  if ((pBVar3 != (BIGNUM *)0x0) && (iVar2 = BN_nnmod(pBVar3,a,m,ctx), iVar2 != 0)) {
    iVar2 = BN_is_zero((BIGNUM *)pBVar3);
    if (iVar2 == 0) {
      if (local_44 < 0x2a0) {
        if (local_44 < 0xf0) {
          if (local_44 < 0x50) {
            local_174 = 1;
            if (0x17 < local_44) {
              local_174 = 3;
            }
          }
          else {
            local_174 = 4;
          }
        }
        else {
          local_174 = 5;
        }
      }
      else {
        local_174 = 6;
      }
      if (1 < local_174) {
        iVar2 = BN_mod_mul(r_00,pBVar3,pBVar3,m,ctx);
        if (iVar2 == 0) goto LAB_00224045;
        for (local_34 = 1; local_34 < 1 << ((char)local_174 - 1U & 0x1f); local_34 = local_34 + 1) {
          pBVar3 = BN_CTX_get(ctx);
          *(BIGNUM **)(&stack0xfffffffffffffe98 + (long)local_34 * 8) = pBVar3;
          if ((pBVar3 == (BIGNUM *)0x0) ||
             (iVar2 = BN_mod_mul(*(BIGNUM **)(&stack0xfffffffffffffe98 + (long)local_34 * 8),
                                 *(BIGNUM **)(&stack0xfffffffffffffe98 + (long)(local_34 + -1) * 8),
                                 r_00,m,ctx), iVar2 == 0)) goto LAB_00224045;
        }
      }
      bVar1 = true;
      local_44 = local_44 + -1;
      iVar2 = BN_set_word(r,1);
      if (iVar2 != 0) {
        do {
          while (iVar2 = BN_is_bit_set(p,local_44), iVar2 == 0) {
            if ((!bVar1) && (iVar2 = BN_mod_mul(r,r,r,m,ctx), iVar2 == 0)) goto LAB_00224045;
            if (local_44 == 0) goto LAB_0022403a;
            local_44 = local_44 + -1;
          }
          local_50 = 1;
          local_48 = 0;
          for (local_34 = 1; (local_34 < (int)local_174 && (-1 < local_44 - local_34));
              local_34 = local_34 + 1) {
            iVar2 = BN_is_bit_set(p,local_44 - local_34);
            if (iVar2 != 0) {
              local_50 = local_50 << ((char)local_34 - (char)local_48 & 0x1fU) | 1;
              local_48 = local_34;
            }
          }
          if (!bVar1) {
            for (local_34 = 0; local_34 < local_48 + 1; local_34 = local_34 + 1) {
              iVar2 = BN_mod_mul(r,r,r,m,ctx);
              if (iVar2 == 0) goto LAB_00224045;
            }
          }
          iVar2 = BN_mod_mul(r,r,*(BIGNUM **)
                                  (&stack0xfffffffffffffe98 + (long)((int)local_50 >> 1) * 8),m,ctx)
          ;
          if (iVar2 == 0) goto LAB_00224045;
          local_44 = local_44 - (local_48 + 1);
          bVar1 = false;
        } while (-1 < local_44);
LAB_0022403a:
        local_40 = 1;
      }
    }
    else {
      BN_zero_ex((BIGNUM *)r);
      local_40 = 1;
    }
  }
LAB_00224045:
  BN_CTX_end(ctx);
  return local_40;
}

Assistant:

int BN_mod_exp_simple(BIGNUM *r, const BIGNUM *a, const BIGNUM *p,
                      const BIGNUM *m, BN_CTX *ctx)
{
    int i, j, bits, ret = 0, wstart, wend, window, wvalue;
    int start = 1;
    BIGNUM *d;
    /* Table of variables obtained from 'ctx' */
    BIGNUM *val[TABLE_SIZE];

    if (BN_get_flags(p, BN_FLG_CONSTTIME) != 0
            || BN_get_flags(a, BN_FLG_CONSTTIME) != 0
            || BN_get_flags(m, BN_FLG_CONSTTIME) != 0) {
        /* BN_FLG_CONSTTIME only supported by BN_mod_exp_mont() */
        ERR_raise(ERR_LIB_BN, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
        return 0;
    }

    bits = BN_num_bits(p);
    if (bits == 0) {
        /* x**0 mod 1, or x**0 mod -1 is still zero. */
        if (BN_abs_is_word(m, 1)) {
            ret = 1;
            BN_zero(r);
        } else {
            ret = BN_one(r);
        }
        return ret;
    }

    BN_CTX_start(ctx);
    d = BN_CTX_get(ctx);
    val[0] = BN_CTX_get(ctx);
    if (val[0] == NULL)
        goto err;

    if (!BN_nnmod(val[0], a, m, ctx))
        goto err;               /* 1 */
    if (BN_is_zero(val[0])) {
        BN_zero(r);
        ret = 1;
        goto err;
    }

    window = BN_window_bits_for_exponent_size(bits);
    if (window > 1) {
        if (!BN_mod_mul(d, val[0], val[0], m, ctx))
            goto err;           /* 2 */
        j = 1 << (window - 1);
        for (i = 1; i < j; i++) {
            if (((val[i] = BN_CTX_get(ctx)) == NULL) ||
                !BN_mod_mul(val[i], val[i - 1], d, m, ctx))
                goto err;
        }
    }

    start = 1;                  /* This is used to avoid multiplication etc
                                 * when there is only the value '1' in the
                                 * buffer. */
    wvalue = 0;                 /* The 'value' of the window */
    wstart = bits - 1;          /* The top bit of the window */
    wend = 0;                   /* The bottom bit of the window */

    if (!BN_one(r))
        goto err;

    for (;;) {
        if (BN_is_bit_set(p, wstart) == 0) {
            if (!start)
                if (!BN_mod_mul(r, r, r, m, ctx))
                    goto err;
            if (wstart == 0)
                break;
            wstart--;
            continue;
        }
        /*
         * We now have wstart on a 'set' bit, we now need to work out how bit
         * a window to do.  To do this we need to scan forward until the last
         * set bit before the end of the window
         */
        wvalue = 1;
        wend = 0;
        for (i = 1; i < window; i++) {
            if (wstart - i < 0)
                break;
            if (BN_is_bit_set(p, wstart - i)) {
                wvalue <<= (i - wend);
                wvalue |= 1;
                wend = i;
            }
        }

        /* wend is the size of the current window */
        j = wend + 1;
        /* add the 'bytes above' */
        if (!start)
            for (i = 0; i < j; i++) {
                if (!BN_mod_mul(r, r, r, m, ctx))
                    goto err;
            }

        /* wvalue will be an odd number < 2^window */
        if (!BN_mod_mul(r, r, val[wvalue >> 1], m, ctx))
            goto err;

        /* move the 'window' down further */
        wstart -= wend + 1;
        wvalue = 0;
        start = 0;
        if (wstart < 0)
            break;
    }
    ret = 1;
 err:
    BN_CTX_end(ctx);
    bn_check_top(r);
    return ret;
}